

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O1

Quat<float> * __thiscall
Imath_3_2::Quat<float>::setRotation(Quat<float> *this,Vec3<float> *from,Vec3<float> *to)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  Vec3<float> local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [28];
  float local_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined8 uVar16;
  
  fVar13 = from->z * from->z + from->x * from->x + from->y * from->y;
  if (fVar13 < 2.3509887e-38) {
    fVar13 = Vec3<float>::lengthTiny(from);
  }
  else if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  local_88 = 0.0;
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    uVar1 = from->x;
    uVar5 = from->y;
    auVar26._4_4_ = uVar5;
    auVar26._0_4_ = uVar1;
    auVar26._8_8_ = 0;
    auVar22._4_4_ = fVar13;
    auVar22._0_4_ = fVar13;
    auVar22._8_4_ = fVar13;
    auVar22._12_4_ = fVar13;
    local_78._0_16_ = divps(auVar26,auVar22);
    local_88 = from->z / fVar13;
  }
  else {
    local_78._0_16_ = ZEXT816(0);
  }
  local_5c = to->z * to->z + to->x * to->x + to->y * to->y;
  uStack_84 = 0;
  uStack_80 = 0;
  uStack_7c = 0;
  if (local_5c < 2.3509887e-38) {
    local_5c = Vec3<float>::lengthTiny(to);
  }
  else {
    if (0.0 <= local_5c) {
      local_5c = SQRT(local_5c);
      goto LAB_001086a5;
    }
    local_5c = sqrtf(local_5c);
  }
LAB_001086a5:
  if ((local_5c != 0.0) || (NAN(local_5c))) {
    uVar2 = to->x;
    uVar6 = to->y;
    auVar28._4_4_ = uVar6;
    auVar28._0_4_ = uVar2;
    auVar28._8_8_ = 0;
    auVar18._4_4_ = local_5c;
    auVar18._0_4_ = local_5c;
    auVar18._8_4_ = local_5c;
    auVar18._12_4_ = local_5c;
    local_38 = divps(auVar28,auVar18);
    local_5c = to->z / local_5c;
  }
  else {
    local_38 = ZEXT816(0);
    local_5c = 0.0;
  }
  local_98 = (float)((ulong)local_78._0_8_ >> 0x20);
  local_a8.x = (float)local_78._0_8_ + local_38._0_4_;
  local_a8.y = local_98 + local_38._4_4_;
  local_a8.z = local_88 + local_5c;
  fVar13 = local_a8.z * local_a8.z + local_a8.x * local_a8.x + local_a8.y * local_a8.y;
  fStack_94 = local_98;
  fStack_90 = local_98;
  fStack_8c = local_98;
  if (local_88 * local_5c + (float)local_78._0_8_ * local_38._0_4_ + local_98 * local_38._4_4_ < 0.0
     ) {
    if (fVar13 < 2.3509887e-38) {
      fVar13 = Vec3<float>::lengthTiny(&local_a8);
    }
    else if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      auVar27._4_4_ = local_a8.y;
      auVar27._0_4_ = local_a8.x;
      auVar27._8_8_ = 0;
      auVar19._4_4_ = fVar13;
      auVar19._0_4_ = fVar13;
      auVar19._8_4_ = fVar13;
      auVar19._12_4_ = fVar13;
      local_28 = divps(auVar27,auVar19);
      auVar25._4_8_ = 0;
      auVar25._0_4_ = local_a8.z / fVar13;
    }
    else {
      local_28 = ZEXT816(0);
      auVar25 = ZEXT812(0);
    }
    local_58._12_4_ = 0;
    local_58._0_12_ = auVar25;
    local_a8.x = local_28._0_4_;
    local_48 = local_28._4_4_;
    local_a8.z = auVar25._0_4_;
    fVar13 = local_a8.z * local_a8.z + local_a8.x * local_a8.x + local_48 * local_48;
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      local_a8.z = local_88 + local_a8.z;
      local_a8.x = (float)local_78._0_4_ + local_a8.x;
      local_a8.y = (float)local_78._4_4_ + local_48;
      fVar13 = local_a8.z * local_a8.z + local_a8.x * local_a8.x + local_a8.y * local_a8.y;
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      if (fVar13 < 2.3509887e-38) {
        fVar13 = Vec3<float>::lengthTiny(&local_a8);
      }
      else if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        fVar13 = SQRT(fVar13);
      }
      uVar17 = local_28._0_8_;
      fVar14 = 0.0;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
        fVar14 = local_a8.x / fVar13;
        auVar21._4_4_ = local_a8.z;
        auVar21._0_4_ = local_a8.y;
        auVar21._8_8_ = 0;
        auVar9._4_4_ = fVar13;
        auVar9._0_4_ = fVar13;
        auVar9._8_4_ = fVar13;
        auVar9._12_4_ = fVar13;
        auVar22 = divps(auVar21,auVar9);
        uVar16 = auVar22._0_8_;
      }
      else {
        uVar16 = 0;
      }
      fVar13 = (float)uVar16;
      fVar15 = (float)((ulong)uVar16 >> 0x20);
      this->r = fVar15 * local_88 + (float)local_78._0_4_ * fVar14 + local_98 * fVar13;
      (this->v).x = fVar15 * (float)local_78._4_4_ + -local_88 * fVar13;
      (this->v).y = fVar14 * local_88 + fVar15 * -(float)local_78._0_4_;
      (this->v).z = fVar13 * (float)local_78._0_4_ + fVar14 * -(float)local_78._4_4_;
      local_a8.z = local_5c + (float)local_58._0_4_;
      local_a8.x = (float)local_38._0_4_ + (float)local_28._0_4_;
      local_a8.y = (float)local_38._4_4_ + (float)local_28._4_4_;
      fVar13 = local_a8.z * local_a8.z + local_a8.x * local_a8.x + local_a8.y * local_a8.y;
      if (fVar13 < 2.3509887e-38) {
        fVar13 = Vec3<float>::lengthTiny(&local_a8);
      }
      else if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        fVar13 = SQRT(fVar13);
        local_28._0_8_ = uVar17;
      }
      fVar14 = 0.0;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
        fVar14 = local_a8.y / fVar13;
        auVar23._4_4_ = local_a8.x;
        auVar23._0_4_ = local_a8.z;
        auVar23._8_8_ = 0;
        auVar10._4_4_ = fVar13;
        auVar10._0_4_ = fVar13;
        auVar10._8_4_ = fVar13;
        auVar10._12_4_ = fVar13;
        auVar22 = divps(auVar23,auVar10);
        uVar17 = auVar22._0_8_;
      }
      else {
        uVar17 = 0;
      }
      fVar15 = (float)uVar17;
      fVar13 = (float)((ulong)uVar17 >> 0x20);
      fVar29 = (float)local_58._0_4_ * fVar15 + fVar13 * (float)local_28._0_4_ + local_48 * fVar14;
      fVar30 = (float)local_58._0_4_ * fVar13 + -(float)local_28._0_4_ * fVar15;
      fVar13 = fVar14 * (float)local_28._0_4_ - fVar13 * (float)local_28._4_4_;
      fVar14 = fVar15 * (float)local_28._4_4_ - fVar14 * (float)local_58._0_4_;
      uVar3 = this->r;
      uVar7 = (this->v).x;
      uVar4 = (this->v).y;
      uVar8 = (this->v).z;
      (this->v).x = ((float)uVar4 * fVar13 - fVar30 * (float)uVar8) +
                    (float)uVar3 * fVar14 + (float)uVar7 * fVar29;
      (this->v).y = ((float)uVar8 * fVar14 - fVar13 * (float)uVar7) +
                    (float)uVar4 * fVar29 + (float)uVar3 * fVar30;
      (this->v).z = ((float)uVar7 * fVar30 - fVar14 * (float)uVar4) +
                    fVar13 * (float)uVar3 + fVar29 * (float)uVar8;
      this->r = (float)uVar3 * fVar29 -
                ((float)uVar8 * fVar13 + (float)uVar7 * fVar14 + fVar30 * (float)uVar4);
    }
    else {
      this->r = 0.0;
      if (((float)local_78._4_4_ * (float)local_78._4_4_ <
           (float)local_78._0_4_ * (float)local_78._0_4_) ||
         (local_88 * local_88 < (float)local_78._0_4_ * (float)local_78._0_4_)) {
        if ((float)local_78._4_4_ * (float)local_78._4_4_ <= local_88 * local_88) {
          local_a8.x = local_98 * 0.0 - local_88;
          local_a8.y = local_88 * 0.0 + (float)local_78._0_4_ * -0.0;
          local_a8.z = (float)local_78._0_4_ - local_98 * 0.0;
        }
        else {
          local_a8.x = local_98 - local_88 * 0.0;
          local_a8.y = local_88 * 0.0 - (float)local_78._0_4_;
          local_a8.z = (float)local_78._0_4_ * 0.0 + local_98 * -0.0;
        }
        fVar13 = local_a8.z * local_a8.z + local_a8.x * local_a8.x + local_a8.y * local_a8.y;
      }
      else {
        local_a8.x = local_98 * 0.0 + local_88 * -0.0;
        local_a8.y = local_88 - (float)local_78._0_4_ * 0.0;
        local_a8.z = (float)local_78._0_4_ * 0.0 - local_98;
        fVar13 = local_a8.z * local_a8.z + local_a8.x * local_a8.x + local_a8.y * local_a8.y;
      }
      if (fVar13 < 2.3509887e-38) {
        fVar13 = Vec3<float>::lengthTiny(&local_a8);
      }
      else if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        fVar13 = SQRT(fVar13);
      }
      fVar14 = 0.0;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
        auVar24._4_4_ = local_a8.y;
        auVar24._0_4_ = local_a8.x;
        auVar24._8_8_ = 0;
        auVar12._4_4_ = fVar13;
        auVar12._0_4_ = fVar13;
        auVar12._8_4_ = fVar13;
        auVar12._12_4_ = fVar13;
        auVar22 = divps(auVar24,auVar12);
        uVar17 = auVar22._0_8_;
        fVar14 = local_a8.z / fVar13;
      }
      else {
        uVar17 = 0;
      }
      (this->v).x = (float)(int)uVar17;
      (this->v).y = (float)(int)((ulong)uVar17 >> 0x20);
      (this->v).z = fVar14;
    }
  }
  else {
    if (fVar13 < 2.3509887e-38) {
      fVar13 = Vec3<float>::lengthTiny(&local_a8);
    }
    else if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
    fVar14 = 0.0;
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      fVar14 = local_a8.x / fVar13;
      auVar20._4_4_ = local_a8.z;
      auVar20._0_4_ = local_a8.y;
      auVar20._8_8_ = 0;
      auVar11._4_4_ = fVar13;
      auVar11._0_4_ = fVar13;
      auVar11._8_4_ = fVar13;
      auVar11._12_4_ = fVar13;
      auVar22 = divps(auVar20,auVar11);
      uVar17 = auVar22._0_8_;
    }
    else {
      uVar17 = 0;
    }
    fVar13 = (float)uVar17;
    fVar29 = (float)local_78._0_8_;
    fVar30 = (float)((ulong)local_78._0_8_ >> 0x20);
    fVar15 = (float)((ulong)uVar17 >> 0x20);
    this->r = fVar15 * local_88 + fVar29 * fVar14 + local_98 * fVar13;
    (this->v).x = fVar15 * fVar30 + -local_88 * fVar13;
    (this->v).y = fVar14 * local_88 + fVar15 * -fVar29;
    (this->v).z = fVar13 * fVar29 + fVar14 * -fVar30;
  }
  return this;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Quat<T>&
Quat<T>::setRotation (const Vec3<T>& from, const Vec3<T>& to) IMATH_NOEXCEPT
{
    //
    // Create a quaternion that rotates vector from into vector to,
    // such that the rotation is around an axis that is the cross
    // product of from and to.
    //
    // This function calls function setRotationInternal(), which is
    // numerically accurate only for rotation angles that are not much
    // greater than pi/2.  In order to achieve good accuracy for angles
    // greater than pi/2, we split large angles in half, and rotate in
    // two steps.
    //

    //
    // Normalize from and to, yielding f0 and t0.
    //

    Vec3<T> f0 = from.normalized ();
    Vec3<T> t0 = to.normalized ();

    if ((f0 ^ t0) >= 0)
    {
        //
        // The rotation angle is less than or equal to pi/2.
        //

        setRotationInternal (f0, t0, *this);
    }
    else
    {
        //
        // The angle is greater than pi/2.  After computing h0,
        // which is halfway between f0 and t0, we rotate first
        // from f0 to h0, then from h0 to t0.
        //

        Vec3<T> h0 = (f0 + t0).normalized ();

        if ((h0 ^ h0) != 0)
        {
            setRotationInternal (f0, h0, *this);

            Quat<T> q;
            setRotationInternal (h0, t0, q);

            *this *= q;
        }
        else
        {
            //
            // f0 and t0 point in exactly opposite directions.
            // Pick an arbitrary axis that is orthogonal to f0,
            // and rotate by pi.
            //

            r = T (0);

            Vec3<T> f02 = f0 * f0;

            if (f02.x <= f02.y && f02.x <= f02.z)
                v = (f0 % Vec3<T> (1, 0, 0)).normalized ();
            else if (f02.y <= f02.z)
                v = (f0 % Vec3<T> (0, 1, 0)).normalized ();
            else
                v = (f0 % Vec3<T> (0, 0, 1)).normalized ();
        }
    }

    return *this;
}